

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  size_t sVar1;
  uint in_ESI;
  secp256k1_context *in_RDI;
  secp256k1_context *ret;
  size_t prealloc_size;
  uint in_stack_0000002c;
  secp256k1_context *local_8;
  
  secp256k1_selftest();
  sVar1 = secp256k1_context_preallocated_size(in_stack_0000002c);
  if (sVar1 == 0) {
    local_8 = (secp256k1_context *)0x0;
  }
  else {
    (in_RDI->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
    (in_RDI->illegal_callback).data = (void *)0x0;
    (in_RDI->error_callback).fn = secp256k1_default_error_callback_fn;
    (in_RDI->error_callback).data = (void *)0x0;
    secp256k1_ecmult_gen_context_build((secp256k1_ecmult_gen_context *)0x10aac25);
    in_RDI->declassify = (uint)((in_ESI & 0x400) != 0);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    size_t prealloc_size;
    secp256k1_context* ret;

    secp256k1_selftest();

    prealloc_size = secp256k1_context_preallocated_size(flags);
    if (prealloc_size == 0) {
        return NULL;
    }
    VERIFY_CHECK(prealloc != NULL);
    ret = (secp256k1_context*)prealloc;
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    /* Flags have been checked by secp256k1_context_preallocated_size. */
    VERIFY_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT);
    secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx);
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return ret;
}